

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::
GenerateDynamicMethodNewBuildMessageInfo(ImmutableMessageLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ImmutableFieldLiteGenerator *pIVar4;
  type ppFVar5;
  FieldDescriptor *field_00;
  size_type sVar6;
  ulong uVar7;
  undefined8 in_RSI;
  long in_RDI;
  uint16 code;
  size_t i_6;
  string line;
  FieldDescriptor *field_1;
  int i_5;
  int i_4;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields_for_is_initialized_check;
  FieldDescriptor *field;
  int i_3;
  unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  sorted_fields;
  int repeated_count;
  int map_count;
  int i_2;
  int total_ints;
  int i_1;
  int total_bits;
  OneofDescriptor *oneof;
  int i;
  int flags;
  vector<unsigned_short,_std::allocator<unsigned_short>_> chars;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_fffffffffffffdd8;
  size_type sVar8;
  FieldDescriptor *in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  undefined4 in_stack_fffffffffffffe18;
  JavaType in_stack_fffffffffffffe1c;
  FieldDescriptor *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  Printer *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  OneofDescriptor *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  size_type local_f8;
  string local_f0 [32];
  FieldDescriptor *local_d0;
  int local_c4;
  FieldDescriptor *local_c0;
  int local_b4;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_b0;
  FieldDescriptor *local_98;
  int local_8c;
  int local_80;
  int local_7c;
  string local_78 [32];
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  OneofDescriptor *local_48;
  int local_40;
  uint local_2c;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_28;
  undefined8 local_10;
  
  local_10 = in_RSI;
  io::Printer::Indent((Printer *)0x54a184);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x54a191);
  local_2c = 0;
  Descriptor::file(*(Descriptor **)(in_RDI + 8));
  bVar1 = SupportFieldPresence((FileDescriptor *)0x54a1c4);
  if (bVar1) {
    local_2c = local_2c | 1;
  }
  Descriptor::options(*(Descriptor **)(in_RDI + 8));
  bVar1 = MessageOptions::message_set_wire_format((MessageOptions *)0x54a22e);
  if (bVar1) {
    local_2c = local_2c | 2;
  }
  WriteIntToUtf16CharSequence
            ((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),in_stack_fffffffffffffdd8);
  Descriptor::field_count(*(Descriptor **)(in_RDI + 8));
  WriteIntToUtf16CharSequence
            ((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),in_stack_fffffffffffffdd8);
  iVar2 = Descriptor::field_count(*(Descriptor **)(in_RDI + 8));
  if (iVar2 == 0) {
    io::Printer::Print<>
              (in_stack_fffffffffffffe30,
               (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  }
  else {
    io::Printer::Print<>
              (in_stack_fffffffffffffe30,
               (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    io::Printer::Indent((Printer *)0x54a2ff);
    Descriptor::oneof_decl_count(*(Descriptor **)(in_RDI + 8));
    WriteIntToUtf16CharSequence
              ((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),in_stack_fffffffffffffdd8);
    for (local_40 = 0; iVar2 = local_40,
        iVar3 = Descriptor::oneof_decl_count(*(Descriptor **)(in_RDI + 8)), iVar2 < iVar3;
        local_40 = local_40 + 1) {
      local_48 = Descriptor::oneof_decl(*(Descriptor **)(in_RDI + 8),local_40);
      Context::GetOneofGeneratorInfo
                ((Context *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48);
      io::Printer::Print<char[11],std::__cxx11::string>
                ((Printer *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                 &in_stack_fffffffffffffe30->variable_delimiter_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    }
    local_4c = 0;
    for (local_50 = 0; iVar2 = local_50,
        iVar3 = Descriptor::field_count(*(Descriptor **)(in_RDI + 8)), iVar2 < iVar3;
        local_50 = local_50 + 1) {
      Descriptor::field(*(Descriptor **)(in_RDI + 8),local_50);
      pIVar4 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         ((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>
                           *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                          (FieldDescriptor *)in_stack_fffffffffffffe48);
      iVar2 = (*pIVar4->_vptr_ImmutableFieldLiteGenerator[2])();
      local_4c = iVar2 + local_4c;
    }
    local_54 = (local_4c + 0x1f) / 0x20;
    for (local_58 = 0; local_58 < local_54; local_58 = local_58 + 1) {
      GetBitFieldName_abi_cxx11_((int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
      io::Printer::Print<char[15],std::__cxx11::string>
                ((Printer *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                 &in_stack_fffffffffffffe30->variable_delimiter_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
      std::__cxx11::string::~string(local_78);
    }
    WriteIntToUtf16CharSequence
              ((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),in_stack_fffffffffffffdd8);
    local_7c = 0;
    local_80 = 0;
    SortFieldsByNumber((Descriptor *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
    std::
    unique_ptr<google::protobuf::FieldDescriptor_const*[],std::default_delete<google::protobuf::FieldDescriptor_const*[]>>
    ::
    unique_ptr<google::protobuf::FieldDescriptor_const**,std::default_delete<google::protobuf::FieldDescriptor_const*[]>,void,bool>
              ((unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                *)in_stack_fffffffffffffde0,(FieldDescriptor **)in_stack_fffffffffffffdd8);
    for (local_8c = 0; iVar2 = local_8c,
        iVar3 = Descriptor::field_count(*(Descriptor **)(in_RDI + 8)), iVar2 < iVar3;
        local_8c = local_8c + 1) {
      ppFVar5 = std::
                unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                ::operator[]((unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                              *)in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
      local_98 = *ppFVar5;
      bVar1 = FieldDescriptor::is_map(in_stack_fffffffffffffde0);
      if (bVar1) {
        local_7c = local_7c + 1;
      }
      else {
        bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x54a701);
        if (bVar1) {
          local_80 = local_80 + 1;
        }
      }
    }
    ppFVar5 = std::
              unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
              ::operator[]((unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                            *)in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
    iVar2 = FieldDescriptor::number(*ppFVar5);
    WriteIntToUtf16CharSequence
              ((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),in_stack_fffffffffffffdd8);
    iVar3 = Descriptor::field_count(*(Descriptor **)(in_RDI + 8));
    field_00 = (FieldDescriptor *)
               std::
               unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
               ::operator[]((unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                             *)in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
    in_stack_fffffffffffffe44 = FieldDescriptor::number(*(FieldDescriptor **)field_00);
    WriteIntToUtf16CharSequence
              ((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),in_stack_fffffffffffffdd8);
    in_stack_fffffffffffffe40 = Descriptor::field_count(*(Descriptor **)(in_RDI + 8));
    WriteIntToUtf16CharSequence
              ((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),in_stack_fffffffffffffdd8);
    WriteIntToUtf16CharSequence
              ((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),in_stack_fffffffffffffdd8);
    WriteIntToUtf16CharSequence
              ((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),in_stack_fffffffffffffdd8);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)0x54a843);
    local_b4 = 0;
    while (in_stack_fffffffffffffe38 = local_b4,
          in_stack_fffffffffffffe3c = Descriptor::field_count(*(Descriptor **)(in_RDI + 8)),
          in_stack_fffffffffffffe38 < in_stack_fffffffffffffe3c) {
      in_stack_fffffffffffffe30 =
           (Printer *)Descriptor::field(*(Descriptor **)(in_RDI + 8),local_b4);
      in_stack_fffffffffffffe2f = FieldDescriptor::is_required((FieldDescriptor *)0x54a8a9);
      if ((bool)in_stack_fffffffffffffe2f) {
LAB_0054a943:
        local_c0 = Descriptor::field(*(Descriptor **)(in_RDI + 8),local_b4);
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)in_stack_fffffffffffffde0,(value_type *)in_stack_fffffffffffffdd8);
      }
      else {
        in_stack_fffffffffffffe20 = Descriptor::field(*(Descriptor **)(in_RDI + 8),local_b4);
        in_stack_fffffffffffffe1c =
             GetJavaType((FieldDescriptor *)
                         CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        if (in_stack_fffffffffffffe1c == JAVATYPE_MESSAGE) {
          Descriptor::field(*(Descriptor **)(in_RDI + 8),local_b4);
          FieldDescriptor::message_type(in_stack_fffffffffffffde0);
          bVar1 = HasRequiredFields((Descriptor *)in_stack_fffffffffffffe20);
          if (bVar1) goto LAB_0054a943;
        }
      }
      local_b4 = local_b4 + 1;
    }
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::size(&local_b0);
    WriteIntToUtf16CharSequence
              ((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),in_stack_fffffffffffffdd8);
    local_c4 = 0;
    while (in_stack_fffffffffffffdf0 = local_c4,
          in_stack_fffffffffffffdf4 = Descriptor::field_count(*(Descriptor **)(in_RDI + 8)),
          in_stack_fffffffffffffdf0 < in_stack_fffffffffffffdf4) {
      ppFVar5 = std::
                unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                ::operator[]((unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                              *)in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
      local_d0 = *ppFVar5;
      in_stack_fffffffffffffde0 =
           (FieldDescriptor *)
           FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                     ((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>
                       *)CONCAT44(iVar2,iVar3),field_00);
      (*(*(_func_int ***)in_stack_fffffffffffffde0)[7])
                (in_stack_fffffffffffffde0,local_10,&local_28);
      local_c4 = local_c4 + 1;
    }
    io::Printer::Outdent((Printer *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    io::Printer::Print<>
              (in_stack_fffffffffffffe30,
               (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    std::
    unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    ::~unique_ptr((unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                   *)in_stack_fffffffffffffde0);
  }
  io::Printer::Print<>
            (in_stack_fffffffffffffe30,
             (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  std::__cxx11::string::string(local_f0);
  local_f8 = 0;
  while (sVar8 = local_f8,
        sVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&local_28),
        sVar8 < sVar6) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[](&local_28,local_f8);
    EscapeUtf16ToString((uint16)((ulong)in_stack_fffffffffffffe20 >> 0x30),
                        (string *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    uVar7 = std::__cxx11::string::size();
    if (0x4f < uVar7) {
      io::Printer::Print<char[7],std::__cxx11::string>
                ((Printer *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                 &in_stack_fffffffffffffe30->variable_delimiter_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
      std::__cxx11::string::clear();
    }
    local_f8 = local_f8 + 1;
  }
  io::Printer::Print<char[7],std::__cxx11::string>
            ((Printer *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
             (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
             &in_stack_fffffffffffffe30->variable_delimiter_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  io::Printer::Print<>
            (in_stack_fffffffffffffe30,
             (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  io::Printer::Outdent((Printer *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  std::__cxx11::string::~string(local_f0);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateDynamicMethodNewBuildMessageInfo(
    io::Printer* printer) {
  printer->Indent();

  // Collect field info into a sequence of UTF-16 chars. It will be embedded
  // as a Java string in the generated code.
  std::vector<uint16> chars;

  int flags = 0;
  if (SupportFieldPresence(descriptor_->file())) {
    flags |= 0x1;
  }
  if (descriptor_->options().message_set_wire_format()) {
    flags |= 0x2;
  }
  WriteIntToUtf16CharSequence(flags, &chars);
  WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);

  if (descriptor_->field_count() == 0) {
    printer->Print("java.lang.Object[] objects = null;");
  } else {
    // A single array of all fields (including oneof, oneofCase, hasBits).
    printer->Print("java.lang.Object[] objects = new java.lang.Object[] {\n");
    printer->Indent();

    // Record the number of oneofs.
    WriteIntToUtf16CharSequence(descriptor_->oneof_decl_count(), &chars);
    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
      const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
      printer->Print(
          "\"$oneof_name$_\",\n"
          "\"$oneof_name$Case_\",\n",
          "oneof_name", context_->GetOneofGeneratorInfo(oneof)->name);
    }

    // Integers for bit fields.
    int total_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      total_bits +=
          field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
    }
    int total_ints = (total_bits + 31) / 32;
    for (int i = 0; i < total_ints; i++) {
      printer->Print("\"$bit_field_name$\",\n", "bit_field_name",
                     GetBitFieldName(i));
    }
    WriteIntToUtf16CharSequence(total_ints, &chars);

    int map_count = 0;
    int repeated_count = 0;
    std::unique_ptr<const FieldDescriptor*[]> sorted_fields(
        SortFieldsByNumber(descriptor_));
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      if (field->is_map()) {
        map_count++;
      } else if (field->is_repeated()) {
        repeated_count++;
      }
    }

    WriteIntToUtf16CharSequence(sorted_fields[0]->number(), &chars);
    WriteIntToUtf16CharSequence(
        sorted_fields[descriptor_->field_count() - 1]->number(), &chars);
    WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);
    WriteIntToUtf16CharSequence(map_count, &chars);
    WriteIntToUtf16CharSequence(repeated_count, &chars);

    std::vector<const FieldDescriptor*> fields_for_is_initialized_check;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (descriptor_->field(i)->is_required() ||
          (GetJavaType(descriptor_->field(i)) == JAVATYPE_MESSAGE &&
           HasRequiredFields(descriptor_->field(i)->message_type()))) {
        fields_for_is_initialized_check.push_back(descriptor_->field(i));
      }
    }
    WriteIntToUtf16CharSequence(fields_for_is_initialized_check.size(), &chars);

    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      field_generators_.get(field).GenerateFieldInfo(printer, &chars);
    }
    printer->Outdent();
    printer->Print("};\n");
  }

  printer->Print("java.lang.String info =\n");
  std::string line;
  for (size_t i = 0; i < chars.size(); i++) {
    uint16 code = chars[i];
    EscapeUtf16ToString(code, &line);
    if (line.size() >= 80) {
      printer->Print("    \"$string$\" +\n", "string", line);
      line.clear();
    }
  }
  printer->Print("    \"$string$\";\n", "string", line);

  printer->Print("return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n");
  printer->Outdent();
}